

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Literals * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::getExport
          (Literals *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,Name name)

{
  long lVar1;
  iterator iVar2;
  size_t *psVar3;
  Name NVar4;
  undefined1 auStack_38 [8];
  Name internalName;
  
  NVar4.super_IString.str._M_str = name.super_IString.str._M_len;
  NVar4.super_IString.str._M_len = (size_t)this->wasm;
  lVar1 = wasm::Module::getExportOrNull(NVar4);
  if ((lVar1 == 0) || (*(int *)(lVar1 + 0x10) != 3)) {
    (*this->externalInterface->_vptr_ExternalInterface[8])
              (this->externalInterface,"getExport external not found");
  }
  psVar3 = (size_t *)0x0;
  if (*(char *)(lVar1 + 0x28) == '\0') {
    psVar3 = (size_t *)(lVar1 + 0x18);
  }
  auStack_38 = (undefined1  [8])*psVar3;
  internalName.super_IString.str._M_len = psVar3[1];
  iVar2 = std::
          _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Literals>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Literals>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
          ::find(&(this->globals)._M_t,(key_type *)auStack_38);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->globals)._M_t._M_impl.super__Rb_tree_header) {
    (*this->externalInterface->_vptr_ExternalInterface[8])
              (this->externalInterface,"getExport internal not found");
  }
  SmallVector<wasm::Literal,_1UL>::SmallVector
            (&__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>,
             (SmallVector<wasm::Literal,_1UL> *)&iVar2._M_node[1]._M_left);
  return __return_storage_ptr__;
}

Assistant:

Literals getExport(Name name) {
    Export* export_ = wasm.getExportOrNull(name);
    if (!export_ || export_->kind != ExternalKind::Global) {
      externalInterface->trap("getExport external not found");
    }
    Name internalName = *export_->getInternalName();
    auto iter = globals.find(internalName);
    if (iter == globals.end()) {
      externalInterface->trap("getExport internal not found");
    }
    return iter->second;
  }